

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_short>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  long lVar6;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  element_type *peVar9;
  element_type *peVar10;
  bool bVar11;
  idx_t index;
  LogicalType *type;
  Vector *this_00;
  Vector *pVVar12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  idx_t iVar15;
  long lVar16;
  idx_t iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long *plVar21;
  UnifiedVectorFormat sdata;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  element_type *local_78;
  element_type *peStack_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(state_vector,count,&local_c0);
  FlatVector::VerifyFlatVector(result);
  index = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar11 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar18 = 0;
  }
  else {
    lVar18 = 0;
    iVar15 = 0;
    do {
      iVar17 = iVar15;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        iVar17 = (idx_t)(local_c0.sel)->sel_vector[iVar15];
      }
      plVar21 = (long *)**(long **)(local_c0.data + iVar17 * 8);
      if (plVar21 != (long *)0x0) {
        lVar18 = (ulong)(*(long *)(*(long *)((*(long **)(local_c0.data + iVar17 * 8))[1] + 8) + -8)
                         != 0 && bVar11) + (plVar21[1] - *plVar21 >> 1) + lVar18;
      }
      iVar15 = iVar15 + 1;
    } while (count != iVar15);
  }
  ListVector::Reserve(result,lVar18 + index);
  this_00 = MapVector::GetKeys(result);
  pVVar12 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar3 = result->data;
    pdVar4 = pVVar12->data;
    uVar20 = 0;
    do {
      uVar13 = uVar20;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)(local_c0.sel)->sel_vector[uVar20];
      }
      uVar1 = uVar20 + offset;
      plVar21 = *(long **)(local_c0.data + uVar13 * 8);
      plVar5 = (long *)*plVar21;
      if (plVar5 == (long *)0x0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          peVar10 = peStack_70;
          peVar9 = local_78;
          local_78 = (element_type *)0x0;
          peStack_70 = (element_type *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (peStack_70 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
          }
          pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar14->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      else {
        *(idx_t *)(pdVar3 + uVar1 * 0x10) = index;
        lVar18 = *plVar5;
        lVar16 = plVar5[1] - lVar18;
        if (lVar16 != 0) {
          lVar16 = lVar16 >> 1;
          lVar6 = *(long *)plVar21[1];
          pdVar7 = this_00->data;
          lVar19 = 0;
          do {
            *(undefined2 *)(pdVar7 + lVar19 * 2 + index * 2) = *(undefined2 *)(lVar18 + lVar19 * 2);
            *(undefined8 *)(pdVar4 + lVar19 * 8 + index * 8) = *(undefined8 *)(lVar6 + lVar19 * 8);
            lVar19 = lVar19 + 1;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar19);
          index = index + lVar19;
        }
        if (bVar11 && *(long *)(*(long *)(plVar21[1] + 8) + -8) != 0) {
          OtherBucketValue((Value *)&local_78,&this_00->type);
          Vector::SetValue(this_00,index,(Value *)&local_78);
          Value::~Value((Value *)&local_78);
          *(undefined8 *)(pdVar4 + index * 8) = *(undefined8 *)(*(long *)(plVar21[1] + 8) + -8);
          index = index + 1;
        }
        plVar21 = (long *)(pdVar3 + uVar1 * 0x10);
        plVar21[1] = index - *plVar21;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != count);
  }
  ListVector::SetListSize(result,index);
  Vector::Verify(result,count);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}